

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1507.c
# Opt level: O2

int test(char *URL)

{
  undefined8 uVar1;
  uint __i;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  timeval older;
  timeval newer;
  int still_running;
  int maxfd;
  undefined8 local_1e0;
  long curl_timeo;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  
  still_running = 1;
  curl_global_init(3);
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1507.c"
                  ,0x3a);
    iVar3 = 0x7c;
  }
  else {
    lVar5 = curl_multi_init();
    if (lVar5 != 0) {
      iVar3 = 0;
      uVar6 = curl_slist_append(0,"<1507-recipient@example.com>");
      curl_easy_setopt(lVar4,0x2712,URL);
      curl_easy_setopt(lVar4,0x2e,1);
      curl_easy_setopt(lVar4,0x4e2c,read_callback);
      curl_easy_setopt(lVar4,0x27ca,"<1507-realuser@example.com>");
      curl_easy_setopt(lVar4,0x27cb,uVar6);
      curl_easy_setopt(lVar4,0x29,1);
      iVar2 = curl_multi_add_handle(lVar5,lVar4);
      uVar1 = _stderr;
      if (iVar2 == 0) {
        older = tutil_tvnow();
        curl_multi_perform(lVar5,&still_running);
        if (still_running != 0) {
          local_1e0 = uVar6;
          do {
            maxfd = -1;
            curl_timeo = -1;
            for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
              fdread.__fds_bits[lVar8] = 0;
            }
            for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
              fdwrite.__fds_bits[lVar8] = 0;
            }
            for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
              fdexcep.__fds_bits[lVar8] = 0;
            }
            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            curl_multi_timeout(lVar5,&curl_timeo);
            if (-1 < curl_timeo) {
              timeout.tv_sec = (ulong)curl_timeo / 1000;
              if ((ulong)curl_timeo < 2000) {
                lVar8 = curl_timeo + -1000;
                if ((ulong)curl_timeo < 1000) {
                  lVar8 = curl_timeo;
                }
                timeout.tv_usec = lVar8 * 1000;
              }
              else {
                timeout.tv_sec = 1;
              }
            }
            curl_multi_fdset(lVar5,&fdread,&fdwrite,&fdexcep,&maxfd);
            iVar3 = select(maxfd + 1,(fd_set *)&fdread,(fd_set *)&fdwrite,(fd_set *)&fdexcep,
                           (timeval *)&timeout);
            newer = tutil_tvnow();
            lVar8 = tutil_tvdiff(newer,older);
            if (60000 < lVar8) {
              curl_mfprintf(_stderr,
                            "ABORTING TEST, since it seems that it would have run forever.\n");
              break;
            }
            if (iVar3 != -1) {
              curl_multi_perform(lVar5,&still_running);
            }
          } while (still_running != 0);
          iVar3 = 0;
          uVar6 = local_1e0;
        }
      }
      else {
        uVar7 = curl_multi_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1507.c"
                      ,0x4d,iVar2,uVar7);
        iVar3 = iVar2;
      }
      goto LAB_00102400;
    }
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1507.c"
                  ,0x3c);
    iVar3 = 0x7b;
  }
  uVar6 = 0;
  lVar5 = 0;
LAB_00102400:
  curl_slist_free_all(uVar6);
  curl_multi_remove_handle(lVar5,lVar4);
  curl_multi_cleanup(lVar5);
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar3;
}

Assistant:

int test(char *URL)
{
   int res = 0;
   CURL *curl = NULL;
   CURLM *mcurl = NULL;
   int still_running = 1;
   struct timeval mp_start;
   struct curl_slist *rcpt_list = NULL;

   curl_global_init(CURL_GLOBAL_DEFAULT);

   easy_init(curl);

   multi_init(mcurl);

   rcpt_list = curl_slist_append(rcpt_list, RECIPIENT);
   /* more addresses can be added here
      rcpt_list = curl_slist_append(rcpt_list, "<others@example.com>");
   */

   curl_easy_setopt(curl, CURLOPT_URL, URL);
#if 0
   curl_easy_setopt(curl, CURLOPT_USERNAME, USERNAME);
   curl_easy_setopt(curl, CURLOPT_PASSWORD, PASSWORD);
#endif
   curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
   curl_easy_setopt(curl, CURLOPT_READFUNCTION, read_callback);
   curl_easy_setopt(curl, CURLOPT_MAIL_FROM, MAILFROM);
   curl_easy_setopt(curl, CURLOPT_MAIL_RCPT, rcpt_list);
   curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
   multi_add_handle(mcurl, curl);

   mp_start = tutil_tvnow();

  /* we start some action by calling perform right away */
  curl_multi_perform(mcurl, &still_running);

  while(still_running) {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(mcurl, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(mcurl, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    if(tutil_tvdiff(tutil_tvnow(), mp_start) > MULTI_PERFORM_HANG_TIMEOUT) {
      fprintf(stderr, "ABORTING TEST, since it seems "
              "that it would have run forever.\n");
      break;
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(mcurl, &still_running);
      break;
    }
  }

test_cleanup:

  curl_slist_free_all(rcpt_list);
  curl_multi_remove_handle(mcurl, curl);
  curl_multi_cleanup(mcurl);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}